

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O3

void ipc_connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  
  if (status == 0) {
    req = (uv_connect_t *)&req[1].type;
    iVar1 = uv_read_start((uv_stream_t *)req,ipc_alloc_cb,ipc_read_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    ipc_connect_cb_cold_1();
  }
  ipc_connect_cb_cold_2();
  *extraout_RDX = &req[2].handle;
  extraout_RDX[1] = 0x10;
  return;
}

Assistant:

static void ipc_connect_cb(uv_connect_t* req, int status) {
  struct ipc_client_ctx* ctx;
  ctx = container_of(req, struct ipc_client_ctx, connect_req);
  ASSERT(0 == status);
  ASSERT(0 == uv_read_start((uv_stream_t*) &ctx->ipc_pipe,
                            ipc_alloc_cb,
                            ipc_read_cb));
}